

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void wasm::
     CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
     ::doStartTry(LocalGraphFlower *self,Expression **currp)

{
  Try *pTVar1;
  Try *local_20;
  
  pTVar1 = Expression::cast<wasm::Try>(*currp);
  std::
  vector<std::vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
  ::emplace_back<>(&(self->
                    super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
                    ).throwingInstsStack);
  local_20 = pTVar1;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &(self->
              super_CFGWalker<wasm::LocalGraphFlower,_wasm::UnifiedExpressionVisitor<wasm::LocalGraphFlower,_void>,_wasm::(anonymous_namespace)::Info>
              ).tryStack,(Expression **)&local_20);
  return;
}

Assistant:

static void doStartTry(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Try>();
    self->throwingInstsStack.emplace_back();
    self->tryStack.push_back(curr);
  }